

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5LeafSeek(Fts5Index *p,int bGe,Fts5SegIter *pIter,u8 *pTerm,int nTerm)

{
  int iVar1;
  uint local_68;
  u32 local_64;
  uint local_60;
  int nExtra;
  u32 i;
  u32 nCmp;
  int bEndOfPage;
  int iPgidx;
  u32 iTermOff;
  u32 nNew;
  u32 nKeep;
  u32 nMatch;
  int n;
  int szLeaf;
  u8 *a;
  int iOff;
  int nTerm_local;
  u8 *pTerm_local;
  Fts5SegIter *pIter_local;
  Fts5Index *pFStack_10;
  int bGe_local;
  Fts5Index *p_local;
  
  _n = pIter->pLeaf->p;
  nCmp = pIter->pLeaf->szLeaf;
  nKeep = pIter->pLeaf->nn;
  nNew = 0;
  iTermOff = 0;
  iPgidx = 0;
  i = 0;
  nMatch = nCmp;
  a._4_4_ = nTerm;
  _iOff = pTerm;
  pTerm_local = (u8 *)pIter;
  pIter_local._4_4_ = bGe;
  pFStack_10 = p;
  iVar1 = sqlite3Fts5GetVarint32(_n + (int)nCmp,(u32 *)&bEndOfPage);
  nCmp = iVar1 + nCmp;
  a._0_4_ = bEndOfPage;
  if ((int)nKeep < bEndOfPage) {
    pFStack_10->rc = 0x10b;
    return;
  }
LAB_001f95b2:
  iPgidx = (int)_n[(int)a];
  iVar1 = (int)a + 1;
  if ((_n[(int)a] & 0x80) != 0) {
    iVar1 = sqlite3Fts5GetVarint32(_n + (int)a,(u32 *)&iPgidx);
    iVar1 = iVar1 + (int)a;
  }
  a._0_4_ = iVar1;
  if (nNew <= iTermOff) {
    if (iTermOff != nNew) {
LAB_001f96cd:
      if ((int)nKeep <= (int)nCmp) {
        i = 1;
        goto LAB_001f9772;
      }
      iVar1 = sqlite3Fts5GetVarint32(_n + (int)nCmp,&iTermOff);
      nCmp = iVar1 + nCmp;
      bEndOfPage = iTermOff + bEndOfPage;
      if ((int)nKeep <= bEndOfPage) {
        pFStack_10->rc = 0x10b;
        return;
      }
      a._0_4_ = bEndOfPage + 1;
      iTermOff = (u32)_n[bEndOfPage];
      if ((_n[bEndOfPage] & 0x80) != 0) {
        a._0_4_ = bEndOfPage;
        iVar1 = sqlite3Fts5GetVarint32(_n + bEndOfPage,&iTermOff);
        a._0_4_ = iVar1 + (int)a;
      }
      goto LAB_001f95b2;
    }
    if ((uint)iPgidx < a._4_4_ - nNew) {
      local_68 = iPgidx;
    }
    else {
      local_68 = a._4_4_ - nNew;
    }
    nExtra = local_68;
    local_60 = 0;
    while ((local_60 < local_68 && (_n[(int)a + local_60] == _iOff[nNew + local_60]))) {
      local_60 = local_60 + 1;
    }
    nNew = local_60 + nNew;
    if (a._4_4_ != nNew) {
      if (((uint)iPgidx <= local_60) || (_n[(int)a + local_60] <= _iOff[nNew])) goto LAB_001f96cd;
      goto LAB_001f9772;
    }
    if (local_60 == iPgidx) goto LAB_001f9895;
  }
LAB_001f9772:
  if (pIter_local._4_4_ == 0) {
    fts5DataRelease(*(Fts5Data **)(pTerm_local + 0x10));
    pTerm_local[0x10] = '\0';
    pTerm_local[0x11] = '\0';
    pTerm_local[0x12] = '\0';
    pTerm_local[0x13] = '\0';
    pTerm_local[0x14] = '\0';
    pTerm_local[0x15] = '\0';
    pTerm_local[0x16] = '\0';
    pTerm_local[0x17] = '\0';
    return;
  }
  if (i == 0) goto LAB_001f9895;
  do {
    fts5SegIterNextPage(pFStack_10,(Fts5SegIter *)pTerm_local);
    if (*(long *)(pTerm_local + 0x10) == 0) {
      return;
    }
    _n = (u8 *)**(undefined8 **)(pTerm_local + 0x10);
  } while (*(int *)(*(long *)(pTerm_local + 0x10) + 8) <=
           *(int *)(*(long *)(pTerm_local + 0x10) + 0xc));
  nCmp = *(u32 *)(*(long *)(pTerm_local + 0x10) + 0xc);
  iVar1 = sqlite3Fts5GetVarint32
                    ((uchar *)(**(long **)(pTerm_local + 0x10) + (long)(int)nCmp),(u32 *)&a);
  nCmp = iVar1 + nCmp;
  if (((int)a < 4) || (*(int *)(*(long *)(pTerm_local + 0x10) + 0xc) <= (int)a)) {
    pFStack_10->rc = 0x10b;
  }
  else {
    iTermOff = 0;
    bEndOfPage = (int)a;
    nKeep = *(u32 *)(*(long *)(pTerm_local + 0x10) + 8);
    iVar1 = sqlite3Fts5GetVarint32(_n + (int)a,(u32 *)&iPgidx);
    a._0_4_ = iVar1 + (int)a;
LAB_001f9895:
    *(int *)(pTerm_local + 0x20) = (int)a + iPgidx;
    if (((int)nKeep < *(int *)(pTerm_local + 0x20)) || (iPgidx == 0)) {
      pFStack_10->rc = 0x10b;
    }
    else {
      *(undefined4 *)(pTerm_local + 0x34) = *(undefined4 *)(pTerm_local + 0x20);
      *(undefined4 *)(pTerm_local + 0x30) = *(undefined4 *)(pTerm_local + 0xc);
      sqlite3Fts5BufferSet(&pFStack_10->rc,(Fts5Buffer *)(pTerm_local + 0x58),iTermOff,_iOff);
      sqlite3Fts5BufferAppendBlob
                (&pFStack_10->rc,(Fts5Buffer *)(pTerm_local + 0x58),iPgidx,_n + (int)a);
      if ((int)nCmp < (int)nKeep) {
        iVar1 = sqlite3Fts5GetVarint32(_n + (int)nCmp,&local_64);
        nCmp = iVar1 + nCmp;
        *(u32 *)(pTerm_local + 0x3c) = bEndOfPage + local_64;
      }
      else {
        *(int *)(pTerm_local + 0x3c) = *(int *)(*(long *)(pTerm_local + 0x10) + 8) + 1;
      }
      *(u32 *)(pTerm_local + 0x38) = nCmp;
      fts5SegIterLoadRowid(pFStack_10,(Fts5SegIter *)pTerm_local);
      fts5SegIterLoadNPos(pFStack_10,(Fts5SegIter *)pTerm_local);
    }
  }
  return;
}

Assistant:

static void fts5LeafSeek(
  Fts5Index *p,                   /* Leave any error code here */
  int bGe,                        /* True for a >= search */
  Fts5SegIter *pIter,             /* Iterator to seek */
  const u8 *pTerm, int nTerm      /* Term to search for */
){
  int iOff;
  const u8 *a = pIter->pLeaf->p;
  int szLeaf = pIter->pLeaf->szLeaf;
  int n = pIter->pLeaf->nn;

  u32 nMatch = 0;
  u32 nKeep = 0;
  u32 nNew = 0;
  u32 iTermOff;
  int iPgidx;                     /* Current offset in pgidx */
  int bEndOfPage = 0;

  assert( p->rc==SQLITE_OK );

  iPgidx = szLeaf;
  iPgidx += fts5GetVarint32(&a[iPgidx], iTermOff);
  iOff = iTermOff;
  if( iOff>n ){
    p->rc = FTS5_CORRUPT;
    return;
  }

  while( 1 ){

    /* Figure out how many new bytes are in this term */
    fts5FastGetVarint32(a, iOff, nNew);
    if( nKeep<nMatch ){
      goto search_failed;
    }

    assert( nKeep>=nMatch );
    if( nKeep==nMatch ){
      u32 nCmp;
      u32 i;
      nCmp = (u32)MIN(nNew, nTerm-nMatch);
      for(i=0; i<nCmp; i++){
        if( a[iOff+i]!=pTerm[nMatch+i] ) break;
      }
      nMatch += i;

      if( (u32)nTerm==nMatch ){
        if( i==nNew ){
          goto search_success;
        }else{
          goto search_failed;
        }
      }else if( i<nNew && a[iOff+i]>pTerm[nMatch] ){
        goto search_failed;
      }
    }

    if( iPgidx>=n ){
      bEndOfPage = 1;
      break;
    }

    iPgidx += fts5GetVarint32(&a[iPgidx], nKeep);
    iTermOff += nKeep;
    iOff = iTermOff;

    if( iOff>=n ){
      p->rc = FTS5_CORRUPT;
      return;
    }

    /* Read the nKeep field of the next term. */
    fts5FastGetVarint32(a, iOff, nKeep);
  }

 search_failed:
  if( bGe==0 ){
    fts5DataRelease(pIter->pLeaf);
    pIter->pLeaf = 0;
    return;
  }else if( bEndOfPage ){
    do {
      fts5SegIterNextPage(p, pIter);
      if( pIter->pLeaf==0 ) return;
      a = pIter->pLeaf->p;
      if( fts5LeafIsTermless(pIter->pLeaf)==0 ){
        iPgidx = pIter->pLeaf->szLeaf;
        iPgidx += fts5GetVarint32(&pIter->pLeaf->p[iPgidx], iOff);
        if( iOff<4 || iOff>=pIter->pLeaf->szLeaf ){
          p->rc = FTS5_CORRUPT;
          return;
        }else{
          nKeep = 0;
          iTermOff = iOff;
          n = pIter->pLeaf->nn;
          iOff += fts5GetVarint32(&a[iOff], nNew);
          break;
        }
      }
    }while( 1 );
  }

 search_success:
  pIter->iLeafOffset = iOff + nNew;
  if( pIter->iLeafOffset>n || nNew<1 ){
    p->rc = FTS5_CORRUPT;
    return;
  }
  pIter->iTermLeafOffset = pIter->iLeafOffset;
  pIter->iTermLeafPgno = pIter->iLeafPgno;

  fts5BufferSet(&p->rc, &pIter->term, nKeep, pTerm);
  fts5BufferAppendBlob(&p->rc, &pIter->term, nNew, &a[iOff]);

  if( iPgidx>=n ){
    pIter->iEndofDoclist = pIter->pLeaf->nn+1;
  }else{
    int nExtra;
    iPgidx += fts5GetVarint32(&a[iPgidx], nExtra);
    pIter->iEndofDoclist = iTermOff + nExtra;
  }
  pIter->iPgidxOff = iPgidx;

  fts5SegIterLoadRowid(p, pIter);
  fts5SegIterLoadNPos(p, pIter);
}